

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

XMLLCPTranscoder * __thiscall
xercesc_4_0::ICUTransService::makeNewLCPTranscoder(ICUTransService *this,MemoryManager *manager)

{
  UConverter *toAdopt;
  ICULCPTranscoder *this_00;
  UErrorCode uerr;
  
  this_00 = (ICULCPTranscoder *)0x0;
  toAdopt = (UConverter *)ucnv_open_70(0);
  if (toAdopt != (UConverter *)0x0) {
    this_00 = (ICULCPTranscoder *)XMemory::operator_new(0x20,manager);
    ICULCPTranscoder::ICULCPTranscoder(this_00,toAdopt);
  }
  return &this_00->super_XMLLCPTranscoder;
}

Assistant:

XMLLCPTranscoder* ICUTransService::makeNewLCPTranscoder(MemoryManager* manager)
{
    //
    //  Try to create a default converter. If it fails, return a null
    //  pointer which will basically cause the system to give up because
    //  we really can't do anything without one.
    //
    UErrorCode uerr = U_ZERO_ERROR;
    UConverter* converter = ucnv_open(NULL, &uerr);
    if (!converter)
        return 0;

    // That went ok, so create an ICU LCP transcoder wrapper and return it
    return new (manager) ICULCPTranscoder(converter);
}